

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void __thiscall
HFFilteredConsumer::HFFilteredConsumer
          (HFFilteredConsumer *this,HighFreqDataType *hf,int ringbufsize,hfs_data_filter_fn *fn,
          HFParsingInfo *parserargs)

{
  int iVar1;
  byte *pbVar2;
  HighFreqDataType HStack_b8;
  
  HighFreqDataType::HighFreqDataType(&HStack_b8,hf);
  HFSubConsumer::HFSubConsumer
            (&this->super_HFSubConsumer,&HStack_b8,(long)ringbufsize,default_consumer_queue_filter);
  HighFreqDataType::~HighFreqDataType(&HStack_b8);
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__HFFilteredConsumer_002e7348;
  this->filter = fn;
  std::vector<int,_std::allocator<int>_>::vector(&(this->args).indices,&parserargs->indices);
  (this->args).sizeOf = parserargs->sizeOf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->args).dataRequested,&parserargs->dataRequested);
  (this->args).dataLength = parserargs->dataLength;
  iVar1 = HighFreqDataType::getByteSize(&(this->super_HFSubConsumer).super_HighFreqSub.dt);
  this->inputsize = (long)iVar1;
  pbVar2 = (byte *)operator_new__((long)iVar1);
  this->input = pbVar2;
  (this->super_HFSubConsumer).super_HighFreqSub.sockType = ST_FILTERED_CONSUMER;
  return;
}

Assistant:

HFFilteredConsumer::HFFilteredConsumer(HighFreqDataType hf, int ringbufsize, hfs_data_filter_fn *fn, HFParsingInfo parserargs)
    : HFSubConsumer(hf, ringbufsize),
      filter(fn),
      args(parserargs),
      inputsize(dt.getByteSize()),
      input(new byte[inputsize])
{
    sockType = ST_FILTERED_CONSUMER;
}